

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O3

int Wlc_PrsFindDefinition(Wlc_Prs_t *p,char *pStr,Vec_Int_t *vFanins,int *pXValue)

{
  undefined8 uVar1;
  byte *pbVar2;
  bool bVar3;
  int iVar4;
  undefined8 in_RAX;
  long lVar5;
  byte *pbVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  byte *pbVar10;
  byte *pbVar11;
  char *pcVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  byte *pbVar16;
  bool bVar17;
  bool bVar18;
  int Beg;
  int End;
  undefined8 local_38;
  
  vFanins->nSize = 0;
  do {
    bVar15 = *pStr;
    pStr = (char *)((byte *)pStr + 1);
  } while (bVar15 == 0x20);
  if (bVar15 != 0x3d) {
    return 0;
  }
  do {
    pbVar6 = (byte *)pStr;
    bVar15 = *pbVar6;
    pStr = (char *)(pbVar6 + 1);
  } while (bVar15 == 0x20);
  if (bVar15 == 0x28) {
    pbVar16 = pbVar6 + -1;
    pbVar11 = (byte *)pStr;
    do {
      pbVar10 = pbVar11;
      if (*pbVar10 == 0) goto LAB_00377a2d;
      pbVar11 = pbVar10 + 1;
    } while ((*pbVar10 != 0x3e) || (pbVar2 = (byte *)pStr, pbVar10[-1] != 0x3e));
    do {
      pbVar11 = pbVar2;
      if (*pbVar11 == 0) goto LAB_00377a2d;
      pbVar2 = pbVar11 + 1;
    } while ((*pbVar11 != 0x3c) || (pbVar11[-1] != 0x3c));
    bVar15 = 0x28;
    iVar7 = 0;
    bVar18 = true;
LAB_003779be:
    if ((!bVar18) || (iVar7 = (iVar7 + (uint)(bVar15 == 0x28)) - (uint)(bVar15 == 0x29), iVar7 != 0)
       ) goto LAB_003779e5;
    *pbVar6 = 0x20;
    ((byte *)pStr)[-1] = 0;
    do {
      bVar15 = pbVar16[1];
      pbVar16 = pbVar16 + 1;
    } while (bVar15 == 0x20);
    iVar9 = 0xd;
    iVar7 = 0xe;
    pbVar6 = pbVar16;
    goto LAB_00377add;
  }
  iVar9 = 9;
  iVar7 = 0xb;
LAB_00377add:
  if ((byte)(bVar15 - 0x3a) < 0xf6) {
    lVar5 = 1;
    if (bVar15 < 0x40) {
      if (bVar15 < 0x26) {
        iVar4 = 0x1a;
        if (bVar15 != 0x21) {
          if (bVar15 != 0x23) goto LAB_00377d0b;
          iVar4 = 0x34;
        }
LAB_00377c7d:
        iVar7 = iVar4;
        pbVar16 = pbVar6 + 1;
        do {
          pbVar6 = pbVar16;
          pbVar16 = pbVar6 + 1;
        } while (*pbVar6 == 0x20);
        if (*pbVar6 == 0x28) {
          iVar9 = 0;
          bVar18 = true;
          bVar15 = 0x28;
          do {
            if ((bVar18) &&
               (iVar9 = (iVar9 + (uint)(bVar15 == 0x28)) - (uint)(bVar15 == 0x29), iVar9 == 0)) {
              pbVar16[-1] = 0x20;
              *pbVar6 = 0x20;
              goto LAB_00377d99;
            }
            bVar17 = bVar15 != 0x5c;
            bVar3 = bVar15 == 0x20;
            if (!bVar17) {
              bVar3 = bVar17;
            }
            if (bVar18) {
              bVar3 = bVar17;
            }
            bVar18 = bVar3;
            bVar15 = *pbVar16;
            pbVar16 = pbVar16 + 1;
          } while (bVar15 != 0);
          pcVar12 = "Expecting closing parenthesis.";
          goto LAB_00377f3c;
        }
LAB_00377d99:
        pbVar16 = (byte *)Wlc_PrsReadName(p,(char *)pbVar6,vFanins);
        if (pbVar16 == (byte *)0x0) {
          pcVar12 = "Cannot read name after !.";
          goto LAB_00377f34;
        }
        goto LAB_00377e38;
      }
      if (bVar15 == 0x26) {
        iVar4 = 0x25;
      }
      else {
        iVar4 = 0x32;
        if (bVar15 != 0x2d) {
LAB_00377d0b:
          local_38 = in_RAX;
          pbVar6 = (byte *)Wlc_PrsReadName(p,(char *)pbVar6,vFanins);
          if (pbVar6 == (byte *)0x0) {
            return 0;
          }
          bVar15 = *pbVar6;
          bVar18 = false;
          if (bVar15 < 0x5b) {
            if (bVar15 < 0x3c) {
              if (bVar15 == 0) {
                iVar7 = 7;
                pbVar16 = pbVar6;
                goto LAB_00377e38;
              }
              if (bVar15 == 0x21) {
LAB_00378236:
                if (pbVar6[1] != 0x3d) {
LAB_0037824b:
                  bVar18 = false;
LAB_0037824d:
                  bVar3 = false;
                  goto switchD_00377d59_default;
                }
                pbVar16 = pbVar6 + 2;
                iVar7 = 0x20;
              }
              else {
                bVar3 = false;
                if (bVar15 != 0x26) goto switchD_00377d59_default;
                if (pbVar6[1] == 0x26) {
                  if (pbVar6[1] != 0x26) goto LAB_00378232;
                  pbVar16 = pbVar6 + 2;
                  iVar7 = 0x1c;
                }
                else {
                  pbVar16 = pbVar6 + 1;
                  iVar7 = 0x10;
                }
              }
            }
            else {
              bVar3 = false;
              switch(bVar15) {
              case 0x3c:
                if (pbVar6[1] == 0x3c) {
                  if (pbVar6[2] == 0x3c) {
                    if (pbVar6[2] != 0x3c) goto LAB_003781ff;
                    iVar7 = 0xc;
                    pbVar16 = pbVar6 + 3;
                  }
                  else {
                    pbVar16 = pbVar6 + 2;
                  }
                }
                else {
LAB_003781ff:
                  if (pbVar6[1] == 0x3d) {
                    bVar3 = true;
                    bVar18 = false;
                    goto switchD_00377d59_default;
                  }
                  iVar7 = 0x21;
                  pbVar16 = pbVar6 + 1;
                }
                break;
              case 0x3d:
                if (pbVar6[1] == 0x3e) {
                  iVar7 = 0x1b;
                  pbVar16 = pbVar6 + 2;
                }
                else {
                  if (pbVar6[1] != 0x3d) {
LAB_00378232:
                    if (bVar15 == 0x21) goto LAB_00378236;
                    goto LAB_0037824b;
                  }
                  iVar7 = 0x1f;
                  pbVar16 = pbVar6 + 2;
                }
                break;
              case 0x3e:
                if (pbVar6[1] == 0x3e) {
                  if (pbVar6[2] == 0x3e) {
                    if (pbVar6[2] != 0x3e) goto LAB_003781f0;
                    pbVar16 = pbVar6 + 3;
                    iVar7 = 10;
                  }
                  else {
                    pbVar16 = pbVar6 + 2;
                    iVar7 = iVar9;
                  }
                }
                else {
LAB_003781f0:
                  if (pbVar6[1] == 0x3d) {
                    bVar18 = true;
                    goto LAB_0037824d;
                  }
                  pbVar16 = pbVar6 + 1;
                  iVar7 = 0x22;
                }
                break;
              case 0x3f:
                pbVar6 = (byte *)Wlc_PrsReadName(p,(char *)(pbVar6 + 1),vFanins);
                if (pbVar6 != (byte *)0x0) {
                  if (*pbVar6 != 0x3a) {
                    pcVar12 = "MUX lacks the colon symbol (:).";
                    goto LAB_00377f3c;
                  }
                  pbVar16 = (byte *)Wlc_PrsReadName(p,(char *)(pbVar6 + 1),vFanins);
                  if (pbVar16 != (byte *)0x0) {
                    if (vFanins->nSize != 3) {
                      __assert_fail("Vec_IntSize(vFanins) == 3",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadVer.c"
                                    ,0x32a,
                                    "int Wlc_PrsFindDefinition(Wlc_Prs_t *, char *, Vec_Int_t *, int *)"
                                   );
                    }
                    uVar1 = *(undefined8 *)(vFanins->pArray + 1);
                    *(ulong *)(vFanins->pArray + 1) =
                         CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
                    iVar7 = 8;
                    goto LAB_00377e38;
                  }
                }
                pcVar12 = "Cannot read name in MUX.";
                goto LAB_00377f34;
              default:
                goto switchD_00377d59_default;
              }
            }
          }
          else if (bVar15 < 0x7c) {
            if (bVar15 == 0x5b) {
              pbVar16 = (byte *)Wlc_PrsFindRange((char *)pbVar6,(int *)((long)&local_38 + 4),
                                                 (int *)&local_38);
              if (pbVar16 == (byte *)0x0) {
                pcVar12 = "Non-standard range.";
                goto LAB_00377f3c;
              }
              Vec_IntPush(vFanins,local_38._4_4_);
              Vec_IntPush(vFanins,(int)local_38);
              iVar7 = 0x16;
              goto LAB_00377e38;
            }
            bVar3 = false;
            if (bVar15 == 0x5e) {
              iVar7 = 0x12;
              if (pbVar6[1] == 0x5e) {
                iVar7 = 0x1e;
              }
              pbVar16 = pbVar6 + 2;
              if (pbVar6[1] != 0x5e) {
                pbVar16 = pbVar6 + 1;
              }
            }
            else {
switchD_00377d59_default:
              if ((bVar3) && (pbVar6[1] == 0x3d)) {
                pbVar16 = pbVar6 + 2;
                iVar7 = 0x23;
              }
              else if ((bVar18) && (pbVar6[1] == 0x3d)) {
                pbVar16 = pbVar6 + 2;
                iVar7 = 0x24;
              }
              else {
                switch(bVar15) {
                case 0x25:
                  iVar7 = 0x2f;
                  pbVar16 = pbVar6 + 1;
                  break;
                default:
switchD_0037829a_caseD_26:
                  Wlc_PrsWriteErrorMessage
                            (p,(char *)pbVar6,"Unsupported operation (%c).",
                             (ulong)(uint)(int)(char)bVar15);
                  return 0;
                case 0x2a:
                  iVar7 = (uint)(pbVar6[1] == 0x2a) * 4 + 0x2d;
                  pbVar16 = pbVar6 + 2;
                  if (pbVar6[1] != 0x2a) {
                    pbVar16 = pbVar6 + 1;
                  }
                  break;
                case 0x2b:
                  iVar7 = 0x2b;
                  pbVar16 = pbVar6 + 1;
                  break;
                case 0x2d:
                  iVar7 = 0x2c;
                  pbVar16 = pbVar6 + 1;
                  break;
                case 0x2f:
                  iVar7 = 0x2e;
                  pbVar16 = pbVar6 + 1;
                }
              }
            }
          }
          else if (bVar15 == 0x7c) {
            if (pbVar6[1] == 0x7c) {
              if (pbVar6[1] != 0x7c) goto switchD_0037829a_caseD_26;
              pbVar16 = pbVar6 + 2;
              iVar7 = 0x1d;
            }
            else {
              pbVar16 = pbVar6 + 1;
              iVar7 = 0x11;
            }
          }
          else {
            bVar3 = false;
            if (bVar15 != 0x7e) goto switchD_00377d59_default;
            bVar14 = pbVar6[1];
            if (bVar14 == 0x7c) {
              pbVar16 = pbVar6 + 2;
              iVar7 = 0x14;
            }
            else if (bVar14 == 0x5e) {
              pbVar16 = pbVar6 + 2;
              iVar7 = 0x15;
            }
            else {
              if (bVar14 != 0x26) goto switchD_0037829a_caseD_26;
              pbVar16 = pbVar6 + 2;
              iVar7 = 0x13;
            }
          }
          pbVar6 = (byte *)Wlc_PrsReadName(p,(char *)(pbVar16 + 1),vFanins);
          if (pbVar6 == (byte *)0x0) {
            return 0;
          }
          do {
            pbVar16 = pbVar6;
            bVar15 = *pbVar16;
            pbVar6 = pbVar16 + 1;
          } while (bVar15 == 0x20);
          if ((iVar7 == 0x2b) && (bVar15 == 0x2b)) {
            pcVar12 = Wlc_PrsReadName(p,(char *)(pbVar16 + 1),vFanins);
            if (pcVar12 == (char *)0x0) {
              return 0;
            }
            pbVar16 = (byte *)(pcVar12 + -1);
            do {
              bVar15 = pbVar16[1];
              pbVar16 = pbVar16 + 1;
            } while (bVar15 == 0x20);
          }
          if (bVar15 != 0) {
            lVar5 = (long)p->vLines->nSize;
            uVar13 = 0xffffffff;
            if (0 < lVar5) {
              lVar8 = 0;
              do {
                if ((long)pbVar16 - (long)p->pBuffer < (long)p->vLines->pArray[lVar8]) {
                  uVar13 = (ulong)((int)lVar8 + 1);
                  break;
                }
                lVar8 = lVar8 + 1;
              } while (lVar5 != lVar8);
            }
            printf("Warning: Trailing symbols \"%s\" in line %d.\n",pbVar16,uVar13);
          }
          goto LAB_00377e38;
        }
      }
    }
    else if (bVar15 < 0x7b) {
      if (bVar15 == 0x40) {
        iVar4 = 0x33;
        goto LAB_00377c7d;
      }
      if (bVar15 != 0x5e) goto LAB_00377d0b;
      iVar4 = 0x27;
    }
    else {
      if (bVar15 == 0x7b) {
        bVar15 = pbVar6[1];
        if (bVar15 != 0) {
          pbVar16 = pbVar6 + 2;
          bVar18 = true;
          bVar14 = bVar15;
          do {
            if (!(bool)(~bVar18 & 1U | bVar14 != 0x7b)) {
              pbVar16 = pbVar6 + 2;
              bVar18 = true;
              bVar14 = bVar15;
              goto LAB_00377dc7;
            }
            bVar17 = bVar14 != 0x5c;
            bVar3 = bVar14 == 0x20;
            if (!bVar17) {
              bVar3 = bVar17;
            }
            if (bVar18) {
              bVar3 = bVar17;
            }
            bVar18 = bVar3;
            bVar14 = *pbVar16;
            pbVar16 = pbVar16 + 1;
          } while (bVar14 != 0);
        }
        do {
          do {
            pbVar16 = pbVar6 + 1;
            pbVar6 = pbVar6 + 1;
          } while (*pbVar16 == 0x20);
          pbVar6 = (byte *)Wlc_PrsReadName(p,(char *)pbVar6,vFanins);
          if (pbVar6 == (byte *)0x0) {
            pcVar12 = "Cannot read name in concatenation.";
            goto LAB_00377f34;
          }
        } while (*pbVar6 == 0x2c);
        if (*pbVar6 != 0x7d) {
          pcVar12 = "Expected comma (,) in this place.";
          goto LAB_00377f3c;
        }
        iVar7 = 0x17;
LAB_00377c70:
        pbVar16 = pbVar6 + 1;
        goto LAB_00377e38;
      }
      if (bVar15 == 0x7c) {
        iVar4 = 0x26;
      }
      else {
        if (bVar15 != 0x7e) goto LAB_00377d0b;
        bVar15 = pbVar6[1];
        lVar5 = 2;
        if (bVar15 == 0x26) {
          iVar4 = 0x28;
        }
        else if (bVar15 == 0x5e) {
          iVar4 = 0x2a;
        }
        else {
          iVar4 = 0xf;
          if (bVar15 != 0x7c) goto LAB_00377c7d;
          iVar4 = 0x29;
        }
      }
    }
    iVar7 = iVar4;
    pbVar16 = (byte *)Wlc_PrsReadName(p,(char *)(pbVar6 + lVar5),vFanins);
    if (pbVar16 == (byte *)0x0) {
      pcVar12 = "Cannot read name after a unary operator.";
      goto LAB_00377f34;
    }
  }
  else {
    pbVar16 = (byte *)Wlc_PrsReadConstant(p,(char *)pbVar6,vFanins,(int *)((long)&local_38 + 4),
                                          (int *)&local_38,pXValue);
    if (pbVar16 == (byte *)0x0) {
      return 0;
    }
    iVar7 = 6;
  }
LAB_00377e38:
  pbVar16 = pbVar16 + -1;
  do {
    bVar15 = pbVar16[1];
    pbVar16 = pbVar16 + 1;
  } while (bVar15 == 0x20);
  if (((byte)(bVar15 - 0x30) < 10) || ((byte)((bVar15 & 0xdf) + 0xbf) < 0x1a)) {
    if (bVar15 == 0) {
      pcVar12 = Wlc_PrsFindName::Buffer;
      goto LAB_00377f0a;
    }
  }
  else {
    if (0x3b < bVar15 - 0x24) {
      return iVar7;
    }
    if ((0x900000000000001U >> ((ulong)(bVar15 - 0x24) & 0x3f) & 1) == 0) {
      return iVar7;
    }
  }
  pcVar12 = Wlc_PrsFindName::Buffer;
  bVar18 = true;
  iVar7 = 0;
  do {
    if (bVar18) {
      if (((byte)(bVar15 - 0x30) < 10) || ((byte)((bVar15 & 0xdf) + 0xbf) < 0x1a)) {
        bVar18 = true;
        goto joined_r0x00377ed6;
      }
      bVar18 = true;
      if (bVar15 != 0x24) {
        if (bVar15 == 0x5c) goto LAB_00377ee3;
        if (bVar15 == 0x5f) goto LAB_00377ef1;
        break;
      }
    }
    else {
      if (bVar15 == 0x20) {
        iVar7 = iVar7 + -1;
        bVar18 = iVar7 == 0;
        goto LAB_00377ef1;
      }
      bVar18 = false;
joined_r0x00377ed6:
      if (bVar15 == 0x5c) {
LAB_00377ee3:
        iVar7 = iVar7 + 1;
        bVar18 = false;
      }
    }
LAB_00377ef1:
    *pcVar12 = bVar15;
    pcVar12 = (char *)((byte *)pcVar12 + 1);
    bVar15 = pbVar16[1];
    pbVar16 = pbVar16 + 1;
  } while (bVar15 != 0);
LAB_00377f0a:
  *pcVar12 = 0;
  Wlc_PrsWriteErrorMessage
            (p,(char *)pbVar16,"Name %s is left at the end of the line.",Wlc_PrsFindName::Buffer);
  return 0;
LAB_00377a2d:
  bVar15 = 0x28;
  iVar7 = 0;
  bVar18 = true;
LAB_00377a34:
  if ((!bVar18) || (iVar7 = (iVar7 + (uint)(bVar15 == 0x28)) - (uint)(bVar15 == 0x29), iVar7 != 0))
  goto LAB_00377a57;
  ((byte *)pStr)[-1] = 0x20;
  *pbVar6 = 0x20;
  do {
    bVar15 = pbVar6[1];
    pbVar6 = pbVar6 + 1;
  } while (bVar15 == 0x20);
  iVar9 = 9;
  iVar7 = 0xb;
  goto LAB_00377add;
LAB_00377a57:
  bVar17 = bVar15 != 0x5c;
  bVar3 = bVar15 == 0x20;
  if (!bVar17) {
    bVar3 = bVar17;
  }
  if (bVar18) {
    bVar3 = bVar17;
  }
  bVar18 = bVar3;
  bVar15 = *pStr;
  pStr = (char *)((byte *)pStr + 1);
  if (bVar15 == 0) goto LAB_00377a86;
  goto LAB_00377a34;
LAB_003779e5:
  bVar17 = bVar15 != 0x5c;
  bVar3 = bVar15 == 0x20;
  if (!bVar17) {
    bVar3 = bVar17;
  }
  if (bVar18) {
    bVar3 = bVar17;
  }
  bVar18 = bVar3;
  bVar15 = *pStr;
  pStr = (char *)((byte *)pStr + 1);
  if (bVar15 == 0) goto LAB_00377a86;
  goto LAB_003779be;
LAB_00377a86:
  pcVar12 = "Expecting closing parenthesis.";
  goto LAB_00377f3c;
  while( true ) {
    bVar17 = bVar14 != 0x5c;
    bVar3 = bVar14 == 0x20;
    if (!bVar17) {
      bVar3 = bVar17;
    }
    if (bVar18) {
      bVar3 = bVar17;
    }
    bVar18 = bVar3;
    bVar14 = *pbVar16;
    pbVar16 = pbVar16 + 1;
    if (bVar14 == 0) break;
LAB_00377dc7:
    if ((bool)(bVar18 & bVar14 == 0x27)) {
      iVar7 = 0x18;
      goto LAB_00378009;
    }
  }
  iVar7 = 0x19;
LAB_00378009:
  pbVar6 = pbVar6 + 2;
  bVar18 = true;
LAB_0037800f:
  if (!(bool)(bVar18 & bVar15 == 0x2c)) goto code_r0x00378018;
  pcVar12 = Wlc_PrsReadName(p,(char *)pbVar6,vFanins);
  if (pcVar12 != (char *)0x0) {
    pbVar6 = (byte *)(pcVar12 + -1);
    do {
      pbVar16 = pbVar6 + 1;
      pbVar6 = pbVar6 + 1;
    } while (*pbVar16 == 0x20);
    if (*pbVar16 != 0x7d) {
      pcVar12 = "There is no closing brace (}).";
      goto LAB_00377f3c;
    }
    goto LAB_00377c70;
  }
  pcVar12 = "Cannot read name in sign-extension.";
  goto LAB_00377f34;
code_r0x00378018:
  bVar17 = bVar15 != 0x5c;
  bVar3 = bVar15 == 0x20;
  if (!bVar17) {
    bVar3 = bVar17;
  }
  if (bVar18) {
    bVar3 = bVar17;
  }
  bVar18 = bVar3;
  bVar15 = *pbVar6;
  pbVar6 = pbVar6 + 1;
  if (bVar15 == 0) goto code_r0x0037803c;
  goto LAB_0037800f;
code_r0x0037803c:
  pcVar12 = "Expecting one comma in this line.";
LAB_00377f34:
  pbVar6 = (byte *)0x0;
LAB_00377f3c:
  Wlc_PrsWriteErrorMessage(p,(char *)pbVar6,pcVar12);
  return 0;
}

Assistant:

static inline int Wlc_PrsFindDefinition( Wlc_Prs_t * p, char * pStr, Vec_Int_t * vFanins, int * pXValue )
{
    char * pName;
    int Type = WLC_OBJ_NONE;
    int fRotating = 0;
    Vec_IntClear( vFanins );
    pStr = Wlc_PrsSkipSpaces( pStr );
    if ( pStr[0] != '=' )
        return 0;
    pStr = Wlc_PrsSkipSpaces( pStr+1 );
    if ( pStr[0] == '(' )
    {
        // consider rotating shifter
        if ( Wlc_PrsFindSymbolTwo(pStr, '>', '>') && Wlc_PrsFindSymbolTwo(pStr, '<', '<') )
        {
            // THIS IS A HACK TO DETECT rotating shifters
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = ' '; *pClose = 0;
            pStr = Wlc_PrsSkipSpaces( pStr );
            fRotating = 1;
        }
        else
        {
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = *pClose = ' ';
            pStr = Wlc_PrsSkipSpaces( pStr );
        }
    }
    if ( Wlc_PrsIsDigit(pStr) )
    {
        int Range, Signed;
        pStr = Wlc_PrsReadConstant( p, pStr, vFanins, &Range, &Signed, pXValue );
        if ( pStr == NULL )
            return 0;
        Type = WLC_OBJ_CONST;
    }
    else if ( pStr[0] == '!' || (pStr[0] == '~' && pStr[1] != '&' && pStr[1] != '|' && pStr[1] != '^') || pStr[0] == '@' || pStr[0] == '#' )
    {
        if ( pStr[0] == '!' )
            Type = WLC_OBJ_LOGIC_NOT;
        else if ( pStr[0] == '~' )
            Type = WLC_OBJ_BIT_NOT;
        else if ( pStr[0] == '@' )
            Type = WLC_OBJ_ARI_SQRT;
        else if ( pStr[0] == '#' )
            Type = WLC_OBJ_ARI_SQUARE;
        else assert( 0 );
        // skip parentheses
        pStr = Wlc_PrsSkipSpaces( pStr+1 );
        if ( pStr[0] == '(' )
        {
            char * pClose = Wlc_PrsFindClosingParenthesis( pStr, '(', ')' );
            if ( pClose == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting closing parenthesis." );
            *pStr = *pClose = ' ';
        }
        if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name after !." );
    }
    else if ( pStr[0] == '-' || 
              pStr[0] == '&' || pStr[0] == '|' || pStr[0] == '^' || 
              (pStr[0] == '~' && pStr[1] == '&') || 
              (pStr[0] == '~' && pStr[1] == '|') || 
              (pStr[0] == '~' && pStr[1] == '^') )
    {
        int shift = 1;
        if ( pStr[0] == '-' )
            Type = WLC_OBJ_ARI_MINUS;
        else if ( pStr[0] == '&' )
            Type = WLC_OBJ_REDUCT_AND;
        else if ( pStr[0] == '|' )
            Type = WLC_OBJ_REDUCT_OR;
        else if ( pStr[0] == '^' )
            Type = WLC_OBJ_REDUCT_XOR;
        else if ( pStr[0] == '~' && pStr[1] == '&' )
            {Type = WLC_OBJ_REDUCT_NAND; shift = 2;}
        else if ( pStr[0] == '~' && pStr[1] == '|' )
            {Type = WLC_OBJ_REDUCT_NOR; shift = 2;}
        else if ( pStr[0] == '~' && pStr[1] == '^' )
            {Type = WLC_OBJ_REDUCT_NXOR; shift = 2;}
        else assert( 0 );
        if ( !(pStr = Wlc_PrsReadName(p, pStr+shift, vFanins)) )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name after a unary operator." );
    }
    else if ( pStr[0] == '{' )
    {
        // THIS IS A HACK TO DETECT zero padding AND sign extension
        if ( Wlc_PrsFindSymbol(pStr+1, '{') )
        {
            if ( Wlc_PrsFindSymbol(pStr+1, '\'') )
                Type = WLC_OBJ_BIT_ZEROPAD;
            else
                Type = WLC_OBJ_BIT_SIGNEXT;
            pStr = Wlc_PrsFindSymbol(pStr+1, ',');
            if ( pStr == NULL )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Expecting one comma in this line." );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in sign-extension." );
            pStr = Wlc_PrsSkipSpaces( pStr );
            if ( pStr[0] != '}' )
                return Wlc_PrsWriteErrorMessage( p, pStr, "There is no closing brace (})." );
        }
        else // concatenation
        {
            while ( 1 )
            {
                pStr = Wlc_PrsSkipSpaces( pStr+1 );
                if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
                    return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in concatenation." );
                if ( pStr[0] == '}' )
                    break;
                if ( pStr[0] != ',' )
                    return Wlc_PrsWriteErrorMessage( p, pStr, "Expected comma (,) in this place." );
            }
            Type = WLC_OBJ_BIT_CONCAT;
        }
        assert( pStr[0] == '}' );
        pStr++;
    }
    else
    {
        if ( !(pStr = Wlc_PrsReadName(p, pStr, vFanins)) )
            return 0;
        // get the next symbol
        if ( pStr[0] == 0 )
            Type = WLC_OBJ_BUF;
        else if ( pStr[0] == '?' )
        {
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in MUX." );
            if ( pStr[0] != ':' )
                return Wlc_PrsWriteErrorMessage( p, pStr, "MUX lacks the colon symbol (:)." );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return Wlc_PrsWriteErrorMessage( p, pStr, "Cannot read name in MUX." );
            assert( Vec_IntSize(vFanins) == 3 );
            ABC_SWAP( int, Vec_IntArray(vFanins)[1], Vec_IntArray(vFanins)[2] );
            Type = WLC_OBJ_MUX;
        }
        else if ( pStr[0] == '[' )
        {
            int End, Beg; char * pLine = pStr;
            pStr = Wlc_PrsFindRange( pStr, &End, &Beg );
            if ( pStr == NULL )
                return Wlc_PrsWriteErrorMessage( p, pLine, "Non-standard range." );
            Vec_IntPushTwo( vFanins, End, Beg );
            Type = WLC_OBJ_BIT_SELECT;
        }
        else 
        {
                 if ( pStr[0] == '>' && pStr[1] == '>' && pStr[2] != '>' ) pStr += 2, Type = fRotating ? WLC_OBJ_ROTATE_R : WLC_OBJ_SHIFT_R;
            else if ( pStr[0] == '>' && pStr[1] == '>' && pStr[2] == '>' ) pStr += 3, Type = WLC_OBJ_SHIFT_RA;      
            else if ( pStr[0] == '<' && pStr[1] == '<' && pStr[2] != '<' ) pStr += 2, Type = fRotating ? WLC_OBJ_ROTATE_L : WLC_OBJ_SHIFT_L;
            else if ( pStr[0] == '<' && pStr[1] == '<' && pStr[2] == '<' ) pStr += 3, Type = WLC_OBJ_SHIFT_LA;      
            else if ( pStr[0] == '&' && pStr[1] != '&'                   ) pStr += 1, Type = WLC_OBJ_BIT_AND;       
            else if ( pStr[0] == '|' && pStr[1] != '|'                   ) pStr += 1, Type = WLC_OBJ_BIT_OR;        
            else if ( pStr[0] == '^' && pStr[1] != '^'                   ) pStr += 1, Type = WLC_OBJ_BIT_XOR;       
            else if ( pStr[0] == '~' && pStr[1] == '&'                   ) pStr += 2, Type = WLC_OBJ_BIT_NAND;       
            else if ( pStr[0] == '~' && pStr[1] == '|'                   ) pStr += 2, Type = WLC_OBJ_BIT_NOR;       
            else if ( pStr[0] == '~' && pStr[1] == '^'                   ) pStr += 2, Type = WLC_OBJ_BIT_NXOR;       
            else if ( pStr[0] == '=' && pStr[1] == '>'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_IMPL;     
            else if ( pStr[0] == '&' && pStr[1] == '&'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_AND;     
            else if ( pStr[0] == '|' && pStr[1] == '|'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_OR;      
            else if ( pStr[0] == '^' && pStr[1] == '^'                   ) pStr += 2, Type = WLC_OBJ_LOGIC_XOR;      
            else if ( pStr[0] == '=' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_EQU;      
            else if ( pStr[0] == '!' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_NOTEQU;      
            else if ( pStr[0] == '<' && pStr[1] != '='                   ) pStr += 1, Type = WLC_OBJ_COMP_LESS;     
            else if ( pStr[0] == '>' && pStr[1] != '='                   ) pStr += 1, Type = WLC_OBJ_COMP_MORE;     
            else if ( pStr[0] == '<' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_LESSEQU;
            else if ( pStr[0] == '>' && pStr[1] == '='                   ) pStr += 2, Type = WLC_OBJ_COMP_MOREEQU;  
            else if ( pStr[0] == '+'                                     ) pStr += 1, Type = WLC_OBJ_ARI_ADD;       
            else if ( pStr[0] == '-'                                     ) pStr += 1, Type = WLC_OBJ_ARI_SUB;       
            else if ( pStr[0] == '*' && pStr[1] != '*'                   ) pStr += 1, Type = WLC_OBJ_ARI_MULTI;     
            else if ( pStr[0] == '/'                                     ) pStr += 1, Type = WLC_OBJ_ARI_DIVIDE;        
            else if ( pStr[0] == '%'                                     ) pStr += 1, Type = WLC_OBJ_ARI_REM;   
            else if ( pStr[0] == '*' && pStr[1] == '*'                   ) pStr += 2, Type = WLC_OBJ_ARI_POWER;
            else return Wlc_PrsWriteErrorMessage( p, pStr, "Unsupported operation (%c).", pStr[0] );
            if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                return 0;
            pStr = Wlc_PrsSkipSpaces( pStr );
            if ( Type == WLC_OBJ_ARI_ADD && pStr[0] == '+' )
            {
                if ( !(pStr = Wlc_PrsReadName(p, pStr+1, vFanins)) )
                    return 0;
                pStr = Wlc_PrsSkipSpaces( pStr );
            }
            if ( pStr[0] )
                printf( "Warning: Trailing symbols \"%s\" in line %d.\n", pStr, Wlc_PrsFindLine(p, pStr) );
        }
    }
    // make sure there is nothing left there
    if ( pStr )
    {
        pStr = Wlc_PrsFindName( pStr, &pName );
        if ( pStr != NULL )
            return Wlc_PrsWriteErrorMessage( p, pStr, "Name %s is left at the end of the line.", pName );   
    }
    return Type;
}